

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O3

void __thiscall
QTabBarPrivate::initBasicStyleOption(QTabBarPrivate *this,QStyleOptionTab *option,int tabIndex)

{
  byte *pbVar1;
  State *pSVar2;
  int iVar3;
  Tab *pTVar4;
  QWidgetData *pQVar5;
  bool bVar6;
  ColorRole CVar7;
  TabPosition TVar8;
  QSize QVar9;
  QTabWidget *this_00;
  QWidget *pQVar10;
  int iVar11;
  QSize QVar12;
  long in_FS_OFFSET;
  QRect QVar13;
  QBrush local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar11 = (int)(this->tabList).d.size;
  if (iVar11 <= tabIndex || (tabIndex < 0 || option == (QStyleOptionTab *)0x0)) goto LAB_00488f70;
  pQVar10 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pTVar4 = (this->tabList).d.ptr[(uint)tabIndex];
  QStyleOption::initFrom(&option->super_QStyleOption,pQVar10);
  pbVar1 = (byte *)((long)&(option->super_QStyleOption).state.
                           super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                           super_QFlagsStorage<QStyle::StateFlag>.i + 1);
  *pbVar1 = *pbVar1 & 0xde;
  QVar13 = QTabBar::tabRect((QTabBar *)pQVar10,tabIndex);
  (option->super_QStyleOption).rect = QVar13;
  iVar3 = this->currentIndex;
  option->row = 0;
  if (this->pressedIndex == tabIndex) {
    pSVar2 = &(option->super_QStyleOption).state;
    *(byte *)&(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
              super_QFlagsStorage<QStyle::StateFlag>.i =
         (byte)(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
               super_QFlagsStorage<QStyle::StateFlag>.i | 4;
  }
  if (iVar3 == tabIndex) {
    pbVar1 = (byte *)((long)&(option->super_QStyleOption).state.
                             super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 1);
    *pbVar1 = *pbVar1 | 0x80;
    bVar6 = QWidget::hasFocus(pQVar10);
    if (bVar6) {
      pbVar1 = (byte *)((long)&(option->super_QStyleOption).state.
                               super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                               super_QFlagsStorage<QStyle::StateFlag>.i + 1);
      *pbVar1 = *pbVar1 | 1;
    }
  }
  if ((pTVar4->field_0xe4 & 1) == 0) {
    pSVar2 = &(option->super_QStyleOption).state;
    *(byte *)&(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
              super_QFlagsStorage<QStyle::StateFlag>.i =
         (byte)(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
               super_QFlagsStorage<QStyle::StateFlag>.i & 0xfe;
  }
  bVar6 = QWidget::isActiveWindow(pQVar10);
  if (bVar6) {
    pbVar1 = (byte *)((long)&(option->super_QStyleOption).state.
                             super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 2);
    *pbVar1 = *pbVar1 | 1;
  }
  if (((((this->field_0x2d1 & 2) == 0) &&
       ((option->super_QStyleOption).rect.x1.m_i ==
        *(int *)&(this->super_QWidgetPrivate).field_0x254)) &&
      ((option->super_QStyleOption).rect.x2.m_i == *(int *)&this->field_0x25c)) &&
     (((option->super_QStyleOption).rect.y1.m_i == *(int *)&this->field_0x258 &&
      ((option->super_QStyleOption).rect.y2.m_i == *(int *)&this->field_0x260)))) {
    pbVar1 = (byte *)((long)&(option->super_QStyleOption).state.
                             super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 1);
    *pbVar1 = *pbVar1 | 0x20;
  }
  option->shape = this->shape;
  QString::operator=(&option->text,(QString *)pTVar4);
  if ((pTVar4->textColor).cspec != Invalid) {
    CVar7 = QWidget::foregroundRole(pQVar10);
    QBrush::QBrush(local_40,&pTVar4->textColor,SolidPattern);
    QPalette::setBrush((int)option + 0x28,Mid,(QBrush *)(ulong)CVar7);
    QBrush::~QBrush(local_40);
  }
  QIcon::operator=(&option->icon,&pTVar4->icon);
  QVar9 = QTabBar::iconSize((QTabBar *)pQVar10);
  option->iconSize = QVar9;
  QVar9.wd.m_i = -1;
  QVar9.ht.m_i = -1;
  QVar12.wd.m_i = -1;
  QVar12.ht.m_i = -1;
  if (pTVar4->leftWidget != (QWidget *)0x0) {
    pQVar5 = pTVar4->leftWidget->data;
    QVar12.wd.m_i = ((pQVar5->crect).x2.m_i - (pQVar5->crect).x1.m_i) + 1;
    QVar12.ht.m_i = ((pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i) + 1;
  }
  option->leftButtonSize = QVar12;
  if (pTVar4->rightWidget != (QWidget *)0x0) {
    pQVar5 = pTVar4->rightWidget->data;
    QVar9.wd.m_i = ((pQVar5->crect).x2.m_i - (pQVar5->crect).x1.m_i) + 1;
    QVar9.ht.m_i = ((pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i) + 1;
  }
  option->rightButtonSize = QVar9;
  option->documentMode = (bool)((byte)((ushort)*(undefined2 *)&this->field_0x2d0 >> 10) & 1);
  if (tabIndex + -1 == this->currentIndex && tabIndex != 0) {
    option->selectedPosition = PreviousIsSelected;
  }
  else if (tabIndex + 1 == this->currentIndex && tabIndex + 1 < iVar11) {
    option->selectedPosition = NextIsSelected;
  }
  else {
    option->selectedPosition = NotAdjacent;
  }
  bVar6 = true;
  if (this->firstVisible == tabIndex) {
LAB_00488e8b:
    if (this->lastVisible == tabIndex) {
      TVar8 = OnlyOneTab;
      if (!bVar6) goto LAB_00488e9d;
    }
    else if ((this->field_0x2d1 & 2) == 0) {
      TVar8 = Middle;
      if (bVar6) {
LAB_00488ecf:
        TVar8 = Beginning;
      }
    }
    else {
      iVar11 = this->pressedIndex + -1;
      if (!bVar6) goto joined_r0x00488eda;
      TVar8 = OnlyOneTab;
      if (iVar11 != tabIndex) goto LAB_00488ecf;
    }
    goto LAB_00488edc;
  }
  if ((this->field_0x2d1 & 2) != 0) {
    bVar6 = this->pressedIndex + 1 == tabIndex;
    goto LAB_00488e8b;
  }
  if (this->lastVisible == tabIndex) {
LAB_00488e9d:
    TVar8 = End;
  }
  else {
    TVar8 = Middle;
    if ((this->field_0x2d1 & 2) != 0) {
      iVar11 = this->pressedIndex + -1;
joined_r0x00488eda:
      TVar8 = Middle;
      if (iVar11 == tabIndex) goto LAB_00488e9d;
    }
  }
LAB_00488edc:
  option->position = TVar8;
  this_00 = (QTabWidget *)QMetaObject::cast((QObject *)&QTabWidget::staticMetaObject);
  if (this_00 != (QTabWidget *)0x0) {
    *(byte *)&(option->features).super_QFlagsStorageHelper<QStyleOptionTab::TabFeature,_4>.
              super_QFlagsStorage<QStyleOptionTab::TabFeature>.i =
         (byte)(option->features).super_QFlagsStorageHelper<QStyleOptionTab::TabFeature,_4>.
               super_QFlagsStorage<QStyleOptionTab::TabFeature>.i | 1;
    pQVar10 = QTabWidget::cornerWidget(this_00,TopLeftCorner);
    if ((pQVar10 != (QWidget *)0x0) ||
       (pQVar10 = QTabWidget::cornerWidget(this_00,BottomLeftCorner), pQVar10 != (QWidget *)0x0)) {
      *(byte *)&(option->cornerWidgets).super_QFlagsStorageHelper<QStyleOptionTab::CornerWidget,_4>.
                super_QFlagsStorage<QStyleOptionTab::CornerWidget>.i =
           (byte)(option->cornerWidgets).super_QFlagsStorageHelper<QStyleOptionTab::CornerWidget,_4>
                 .super_QFlagsStorage<QStyleOptionTab::CornerWidget>.i | 1;
    }
    pQVar10 = QTabWidget::cornerWidget(this_00,TopRightCorner);
    if ((pQVar10 != (QWidget *)0x0) ||
       (pQVar10 = QTabWidget::cornerWidget(this_00,BottomRightCorner), pQVar10 != (QWidget *)0x0)) {
      *(byte *)&(option->cornerWidgets).super_QFlagsStorageHelper<QStyleOptionTab::CornerWidget,_4>.
                super_QFlagsStorage<QStyleOptionTab::CornerWidget>.i =
           (byte)(option->cornerWidgets).super_QFlagsStorageHelper<QStyleOptionTab::CornerWidget,_4>
                 .super_QFlagsStorage<QStyleOptionTab::CornerWidget>.i | 2;
    }
  }
  if ((pTVar4->field_0xe4 & 4) != 0) {
    *(byte *)&(option->features).super_QFlagsStorageHelper<QStyleOptionTab::TabFeature,_4>.
              super_QFlagsStorage<QStyleOptionTab::TabFeature>.i =
         (byte)(option->features).super_QFlagsStorageHelper<QStyleOptionTab::TabFeature,_4>.
               super_QFlagsStorage<QStyleOptionTab::TabFeature>.i | 2;
  }
  option->tabIndex = tabIndex;
LAB_00488f70:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTabBarPrivate::initBasicStyleOption(QStyleOptionTab *option, int tabIndex) const
{
    Q_Q(const QTabBar);
    const int totalTabs = tabList.size();

    if (!option || (tabIndex < 0 || tabIndex >= totalTabs))
        return;

    const QTabBarPrivate::Tab &tab = *tabList.at(tabIndex);
    option->initFrom(q);
    option->state &= ~(QStyle::State_HasFocus | QStyle::State_MouseOver);
    option->rect = q->tabRect(tabIndex);
    const bool isCurrent = tabIndex == currentIndex;
    option->row = 0;
    if (tabIndex == pressedIndex)
        option->state |= QStyle::State_Sunken;
    if (isCurrent)
        option->state |= QStyle::State_Selected;
    if (isCurrent && q->hasFocus())
        option->state |= QStyle::State_HasFocus;
    if (!tab.enabled)
        option->state &= ~QStyle::State_Enabled;
    if (q->isActiveWindow())
        option->state |= QStyle::State_Active;
    if (!dragInProgress && option->rect == hoverRect)
        option->state |= QStyle::State_MouseOver;
    option->shape = shape;
    option->text = tab.text;

    if (tab.textColor.isValid())
        option->palette.setColor(q->foregroundRole(), tab.textColor);
    option->icon = tab.icon;
    option->iconSize = q->iconSize();  // Will get the default value then.

    option->leftButtonSize = tab.leftWidget ? tab.leftWidget->size() : QSize();
    option->rightButtonSize = tab.rightWidget ? tab.rightWidget->size() : QSize();
    option->documentMode = documentMode;

    if (tabIndex > 0 && tabIndex - 1 == currentIndex)
        option->selectedPosition = QStyleOptionTab::PreviousIsSelected;
    else if (tabIndex + 1 < totalTabs && tabIndex + 1 == currentIndex)
        option->selectedPosition = QStyleOptionTab::NextIsSelected;
    else
        option->selectedPosition = QStyleOptionTab::NotAdjacent;

    const bool paintBeginning = (tabIndex == firstVisible) || (dragInProgress && tabIndex == pressedIndex + 1);
    const bool paintEnd = (tabIndex == lastVisible) || (dragInProgress && tabIndex == pressedIndex - 1);
    if (paintBeginning) {
        if (paintEnd)
            option->position = QStyleOptionTab::OnlyOneTab;
        else
            option->position = QStyleOptionTab::Beginning;
    } else if (paintEnd) {
        option->position = QStyleOptionTab::End;
    } else {
        option->position = QStyleOptionTab::Middle;
    }

#if QT_CONFIG(tabwidget)
    if (const QTabWidget *tw = qobject_cast<const QTabWidget *>(q->parentWidget())) {
        option->features |= QStyleOptionTab::HasFrame;
        if (tw->cornerWidget(Qt::TopLeftCorner) || tw->cornerWidget(Qt::BottomLeftCorner))
            option->cornerWidgets |= QStyleOptionTab::LeftCornerWidget;
        if (tw->cornerWidget(Qt::TopRightCorner) || tw->cornerWidget(Qt::BottomRightCorner))
            option->cornerWidgets |= QStyleOptionTab::RightCornerWidget;
    }
#endif
    if (tab.measuringMinimum)
        option->features |= QStyleOptionTab::MinimumSizeHint;
    option->tabIndex = tabIndex;
}